

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdNormalize_rec(char *pStr,char **p,int *pMatches)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  char cVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  byte *__dest;
  ulong uVar10;
  int local_68 [14];
  
  do {
    if (**p == '!') {
      *p = *p + 1;
    }
    pcVar2 = *p;
    cVar5 = *pcVar2;
    if ((byte)(cVar5 + 0xbfU) < 6 || (byte)(cVar5 - 0x30U) < 10) {
      do {
        pcVar2 = pcVar2 + 1;
        *p = pcVar2;
        cVar5 = *pcVar2;
      } while ((byte)(cVar5 - 0x30U) < 10 || (byte)(cVar5 + 0xbfU) < 6);
    }
    if ((cVar5 == '<') && (pStr[(long)pMatches[(long)pcVar2 - (long)pStr] + 1] == '{')) {
      *p = pStr + (long)pMatches[(long)pcVar2 - (long)pStr] + 1;
    }
    pbVar4 = (byte *)*p;
    bVar1 = *pbVar4;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      return;
    }
    if (bVar1 < 0x5b) {
      if (bVar1 != 0x3c) {
        if (bVar1 != 0x28) {
LAB_0049509b:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x102,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
LAB_00494f90:
        if ((int)(char)bVar1 + (uint)(bVar1 != 0x28) + 1 !=
            (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]) {
          __assert_fail("*q == **p + 1 + (**p != \'(\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0xe1,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
        __dest = pbVar4 + 1;
        pbVar7 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
        *p = (char *)__dest;
        uVar10 = 0;
        pbVar4 = __dest;
        if (__dest < pbVar7) {
          uVar10 = 0;
          do {
            local_68[uVar10] = (int)pbVar4 - (int)pStr;
            uVar10 = uVar10 + 1;
            Dau_DsdNormalize_rec(pStr,p,pMatches);
            pbVar4 = (byte *)(*p + 1);
            *p = (char *)pbVar4;
          } while (pbVar4 < pbVar7);
        }
        local_68[uVar10 & 0xffffffff] = (int)pbVar4 - (int)pStr;
        if (pbVar4 == pbVar7) {
          Dau_DsdNormalizePerm(pStr,local_68,(int)uVar10);
          pcVar2 = Dau_DsdNormalize_rec::pBuffer;
          if ((int)uVar10 != 0) {
            pcVar2 = Dau_DsdNormalize_rec::pBuffer;
            uVar6 = 0;
            do {
              lVar8 = (long)Dau_DsdNormalizePerm::pPerm[uVar6];
              lVar9 = (long)local_68[lVar8];
              if (local_68[lVar8] < local_68[lVar8 + 1]) {
                do {
                  *pcVar2 = pStr[lVar9];
                  pcVar2 = pcVar2 + 1;
                  lVar9 = lVar9 + 1;
                } while (lVar9 < local_68[lVar8 + 1]);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != (uVar10 & 0xffffffff));
          }
          if (pcVar2 + -0xc247e0 == *p + -(long)__dest) {
            memcpy(__dest,Dau_DsdNormalize_rec::pBuffer,(size_t)(pcVar2 + -0xc247e0));
            return;
          }
          __assert_fail("pStore - pBuffer == *p - pOld",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0xef,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0xe8,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
    }
    else if (bVar1 != 0x7b) {
      if (bVar1 != 0x5b) goto LAB_0049509b;
      goto LAB_00494f90;
    }
    if ((uint)(bVar1 != 0x28) + (int)(char)bVar1 + 1 !=
        (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0xf6,"void Dau_DsdNormalize_rec(char *, char **, int *)");
    }
    pcVar2 = pStr + pMatches[(long)pbVar4 - (long)pStr];
    if ((bVar1 != 0x3c) || (pcVar2[1] != '{')) {
      while( true ) {
        pcVar3 = *p + 1;
        *p = pcVar3;
        if (pcVar2 <= pcVar3) break;
        Dau_DsdNormalize_rec(pStr,p,pMatches);
      }
      if (pcVar3 == pcVar2) {
        return;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0xff,"void Dau_DsdNormalize_rec(char *, char **, int *)");
    }
    *p = pcVar2 + 1;
  } while( true );
}

Assistant:

void Dau_DsdNormalize_rec( char * pStr, char ** p, int * pMatches )
{
    static char pBuffer[DAU_MAX_STR];
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        char * pStore, * pOld = *p + 1;
        char * q = pStr + pMatches[ *p - pStr ];
        int i, * pPerm, nMarks = 0, pMarks[DAU_MAX_VAR+1];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            pMarks[nMarks++] = *p - pStr;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        }
        pMarks[nMarks] = *p - pStr;
        assert( *p == q );
        // add to buffer in good order
        pPerm = Dau_DsdNormalizePerm( pStr, pMarks, nMarks );
        // copy to the buffer
        pStore = pBuffer;
        for ( i = 0; i < nMarks; i++ )
            pStore = Dau_DsdNormalizeCopy( pStore, pStr, pMarks, pPerm[i] );
        assert( pStore - pBuffer == *p - pOld );
        memcpy( pOld, pBuffer, pStore - pBuffer );
        return;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( (**p == '<') && (*(q+1) == '{') )
        {
            *p = q+1;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
            return;
        }
        for ( (*p)++; *p < q; (*p)++ )
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        assert( *p == q );
        return;
    }
    assert( 0 );
}